

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O0

void Imf_3_4::anon_unknown_0::sendCode
               (uint64_t sCode,int runCount,uint64_t runCode,uint64_t *c,int *lc,char **out)

{
  int *lc_00;
  uint64_t uVar1;
  uint64_t *c_00;
  uint64_t *in_RCX;
  uint64_t in_RDX;
  int in_ESI;
  uint64_t in_RDI;
  int *in_R8;
  char **in_R9;
  char **in_stack_ffffffffffffffb8;
  int local_c;
  
  lc_00 = (int *)hufLength(in_RDI);
  uVar1 = hufLength(in_RDX);
  c_00 = (uint64_t *)((long)lc_00 + uVar1 + 8);
  uVar1 = hufLength(in_RDI);
  local_c = in_ESI;
  if (c_00 < (uint64_t *)(uVar1 * (long)in_ESI)) {
    outputCode((uint64_t)in_R9,c_00,lc_00,in_stack_ffffffffffffffb8);
    outputCode((uint64_t)in_R9,c_00,lc_00,in_stack_ffffffffffffffb8);
    outputBits(8,(long)in_ESI,in_RCX,in_R8,in_R9);
  }
  else {
    while (-1 < local_c) {
      outputCode((uint64_t)in_R9,c_00,lc_00,in_stack_ffffffffffffffb8);
      local_c = local_c + -1;
    }
  }
  return;
}

Assistant:

inline void
sendCode (
    uint64_t  sCode,
    int       runCount,
    uint64_t  runCode,
    uint64_t& c,
    int&      lc,
    char*&    out)
{
    //
    // Output a run of runCount instances of the symbol sCount.
    // Output the symbols explicitly, or if that is shorter, output
    // the sCode symbol once followed by a runCode symbol and runCount
    // expressed as an 8-bit number.
    //

    if (hufLength (sCode) + hufLength (runCode) + 8 <
        hufLength (sCode) * runCount)
    {
        outputCode (sCode, c, lc, out);
        outputCode (runCode, c, lc, out);
        outputBits (8, runCount, c, lc, out);
    }
    else
    {
        while (runCount-- >= 0)
            outputCode (sCode, c, lc, out);
    }
}